

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void errorlimit(FuncState *fs,int limit,char *what)

{
  char *local_30;
  char *msg;
  char *what_local;
  int limit_local;
  FuncState *fs_local;
  
  if (fs->f->linedefined == 0) {
    local_30 = luaO_pushfstring(fs->L,"main function has more than %d %s",(ulong)(uint)limit,what);
  }
  else {
    local_30 = luaO_pushfstring(fs->L,"function at line %d has more than %d %s",
                                (ulong)(uint)fs->f->linedefined,(ulong)(uint)limit,what);
  }
  luaX_lexerror(fs->ls,local_30,0);
  return;
}

Assistant:

static void errorlimit(FuncState*fs,int limit,const char*what){
const char*msg=(fs->f->linedefined==0)?
luaO_pushfstring(fs->L,"main function has more than %d %s",limit,what):
luaO_pushfstring(fs->L,"function at line %d has more than %d %s",
fs->f->linedefined,limit,what);
luaX_lexerror(fs->ls,msg,0);
}